

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getDigits(char *zDate,...)

{
  int iVar1;
  undefined8 *local_180;
  int *local_168;
  int *local_150;
  int *local_138;
  int *local_120;
  int local_108 [47];
  int local_4c;
  int cnt;
  int *pVal;
  int nextC;
  int max;
  int min;
  int N;
  int val;
  va_list ap;
  char *zDate_local;
  
  local_4c = 0;
  ap[0]._0_8_ = &stack0x00000008;
  N = 8;
  ap[0].reg_save_area = zDate;
  while( true ) {
    if ((uint)N < 0x29) {
      local_120 = (int *)((long)local_108 + (long)N);
      N = N + 8;
    }
    else {
      local_120 = (int *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    if ((uint)N < 0x29) {
      local_138 = (int *)((long)local_108 + (long)N);
      N = N + 8;
    }
    else {
      local_138 = (int *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    if ((uint)N < 0x29) {
      local_150 = (int *)((long)local_108 + (long)N);
      N = N + 8;
    }
    else {
      local_150 = (int *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    if ((uint)N < 0x29) {
      local_168 = (int *)((long)local_108 + (long)N);
      N = N + 8;
    }
    else {
      local_168 = (int *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    iVar1 = *local_168;
    if ((uint)N < 0x29) {
      local_180 = (undefined8 *)((long)local_108 + (long)N);
      N = N + 8;
    }
    else {
      local_180 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    min = 0;
    max = *local_120;
    while (max != 0) {
      if ((""[*ap[0].reg_save_area] & 4) == 0) {
        return local_4c;
      }
      min = min * 10 + (int)*ap[0].reg_save_area + -0x30;
      ap[0].reg_save_area = (void *)((long)ap[0].reg_save_area + 1);
      max = max + -1;
    }
    if (min < *local_138) {
      return local_4c;
    }
    if (*local_150 < min) {
      return local_4c;
    }
    if ((iVar1 != 0) && (iVar1 != *ap[0].reg_save_area)) break;
    *(int *)*local_180 = min;
    ap[0].reg_save_area = (void *)((long)ap[0].reg_save_area + 1);
    local_4c = local_4c + 1;
    if (iVar1 == 0) {
      return local_4c;
    }
  }
  return local_4c;
}

Assistant:

static int getDigits(const char *zDate, ...){
  va_list ap;
  int val;
  int N;
  int min;
  int max;
  int nextC;
  int *pVal;
  int cnt = 0;
  va_start(ap, zDate);
  do{
    N = va_arg(ap, int);
    min = va_arg(ap, int);
    max = va_arg(ap, int);
    nextC = va_arg(ap, int);
    pVal = va_arg(ap, int*);
    val = 0;
    while( N-- ){
      if( !sqlite3Isdigit(*zDate) ){
        goto end_getDigits;
      }
      val = val*10 + *zDate - '0';
      zDate++;
    }
    if( val<min || val>max || (nextC!=0 && nextC!=*zDate) ){
      goto end_getDigits;
    }
    *pVal = val;
    zDate++;
    cnt++;
  }while( nextC );
end_getDigits:
  va_end(ap);
  return cnt;
}